

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Federate::setExecutingEntryCallback(Federate *this,function<void_()> *callback)

{
  string_view message;
  Modes MVar1;
  undefined8 uVar2;
  function<void_()> *in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  function<void_()> *in_stack_ffffffffffffffe8;
  
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x21f476);
  if (MVar1 != PENDING_EXEC) {
    MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x21f488);
    if (MVar1 != PENDING_INIT) {
      std::function<void_()>::operator=(in_RSI,in_stack_ffffffffffffffe8);
      return;
    }
  }
  uVar2 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_RDI);
  message._M_str = (char *)in_RSI;
  message._M_len = (size_t)in_stack_ffffffffffffffe8;
  InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_stack_ffffffffffffffe0,message)
  ;
  __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

void Federate::setExecutingEntryCallback(std::function<void()> callback)
{
    if (currentMode == Modes::PENDING_EXEC || currentMode == Modes::PENDING_INIT) {
        throw(InvalidFunctionCall(
            "cannot update executing entry callback during an async operation"));  // LCOV_EXCL_LINE
    }
    executingEntryCallback = std::move(callback);
}